

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store-sell.c
# Opt level: O0

_Bool borg_think_shop_sell(void)

{
  int iVar1;
  borg_item_conflict *item_00;
  char *what;
  borg_item_conflict *item;
  int qty;
  
  if ((borg.goal.shop == shop_num) && (-1 < borg.goal.item)) {
    item_00 = borg_items + borg.goal.item;
    iVar1 = borg_min_item_quantity(item_00);
    what = format("# Selling %s",item_00);
    borg_note(what);
    borg_keypress(0x73);
    borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[borg.goal.item]);
    if ((1 < item_00->iqty) || (1 < iVar1)) {
      if (iVar1 == 5) {
        borg_keypress(0x35);
      }
      if (iVar1 == 4) {
        borg_keypress(0x34);
      }
      if (iVar1 == 3) {
        borg_keypress(0x33);
      }
      if (iVar1 == 2) {
        borg_keypress(0x32);
      }
      borg_keypress(0x9c);
    }
    if (borg.goal.shop != 7) {
      borg_keypress(0x9c);
      borg_keypress(0xe000);
      borg_keypress(0xe000);
      borg_keypress(0xe000);
    }
    if (8 < sold_item_nxt) {
      sold_item_nxt = 0;
    }
    sold_item_pval[sold_item_nxt] = (int)item_00->pval;
    sold_item_tval[sold_item_nxt] = (uint)item_00->tval;
    sold_item_sval[sold_item_nxt] = (uint)item_00->sval;
    sold_item_store[sold_item_nxt] = (int)borg.goal.shop;
    sold_item_num = sold_item_nxt;
    sold_item_nxt = sold_item_nxt + 1;
    borg.goal.item = -1;
    borg.goal.ware = -1;
    borg.goal.shop = -1;
    borg.time_this_panel = borg.time_this_panel + 1;
    borg_keypress(0xe000);
    borg_keypress(0xe000);
    borg_keypress(0xe000);
    borg.in_shop = false;
    borg_do_inven = true;
    item._7_1_ = true;
  }
  else {
    item._7_1_ = false;
  }
  return item._7_1_;
}

Assistant:

bool borg_think_shop_sell(void)
{
    int qty = 1;

    /* Sell something if requested */
    if ((borg.goal.shop == shop_num) && (borg.goal.item >= 0)) {
        borg_item *item = &borg_items[borg.goal.item];

        qty             = borg_min_item_quantity(item);

        /* Log */
        borg_note(format("# Selling %s", item->desc));

        /* Sell an item */
        borg_keypress('s');

        /* Sell the desired item */
        borg_keypress(all_letters_nohjkl[borg.goal.item]);

        /* Hack -- Sell a single item */
        if (item->iqty > 1 || qty >= 2) {
            if (qty == 5)
                borg_keypress('5');
            if (qty == 4)
                borg_keypress('4');
            if (qty == 3)
                borg_keypress('3');
            if (qty == 2)
                borg_keypress('2');
            borg_keypress(KC_ENTER);
        }

        /* Mega-Hack -- Accept the price */
        if (borg.goal.shop != BORG_HOME) {
            borg_keypress(KC_ENTER);
            borg_keypress(ESCAPE);
            borg_keypress(ESCAPE);
            borg_keypress(ESCAPE);
        }

        /* Mark our last item sold */
        if (sold_item_nxt >= 9)
            sold_item_nxt = 0;
        sold_item_pval[sold_item_nxt]  = item->pval;
        sold_item_tval[sold_item_nxt]  = item->tval;
        sold_item_sval[sold_item_nxt]  = item->sval;
        sold_item_store[sold_item_nxt] = borg.goal.shop;
        sold_item_num                  = sold_item_nxt;
        sold_item_nxt++;

        /* The purchase is complete */
        borg.goal.shop = borg.goal.ware = borg.goal.item = -1;

        /* tick the anti-loop clock */
        borg.time_this_panel++;

        /* I'm not in a store */
        borg_keypress(ESCAPE);
        borg_keypress(ESCAPE);
        borg_keypress(ESCAPE);
        borg.in_shop  = false;
        borg_do_inven = true;
        /* Success */
        return true;
    }

    /* Nope */
    return false;
}